

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O2

WirehairResult __thiscall wirehair::Codec::EncodeFeed(Codec *this,void *message_in)

{
  bool bVar1;
  WirehairResult WVar2;
  uint16_t id;
  uint row_seed;
  
  if (message_in == (void *)0x0) {
    WVar2 = Wirehair_InvalidInput;
  }
  else {
    SetInput(this,message_in);
    row_seed = 0;
    WVar2 = Wirehair_BadPeelSeed;
    do {
      if (this->_block_count <= row_seed) {
        WVar2 = SolveMatrix(this);
        if (WVar2 == Wirehair_NeedMore) {
          return Wirehair_BadPeelSeed;
        }
        if (WVar2 != Wirehair_Success) {
          return WVar2;
        }
        GenerateRecoveryBlocks(this);
        return Wirehair_Success;
      }
      bVar1 = OpportunisticPeeling(this,(uint16_t)row_seed,row_seed);
      row_seed = row_seed + 1;
    } while (bVar1);
  }
  return WVar2;
}

Assistant:

WirehairResult Codec::EncodeFeed(const void * GF256_RESTRICT message_in)
{
    CAT_IF_DUMP(cout << endl << "---- EncodeFeed ----" << endl << endl;)

    // Validate input
    if (message_in == nullptr) {
        return Wirehair_InvalidInput;
    }

    SetInput(message_in);

    // For each input row:
    for (uint16_t id = 0; id < _block_count; ++id) {
        if (!OpportunisticPeeling(id, id)) {
            return Wirehair_BadPeelSeed;
        }
    }

    // Solve matrix and generate recovery blocks
    WirehairResult result = SolveMatrix();

    if (result == Wirehair_Success) {
        GenerateRecoveryBlocks();
        return Wirehair_Success;
    }
    else if (result == Wirehair_NeedMore) {
        return Wirehair_BadPeelSeed;
    }
    else {
        return result;
    }
}